

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_data_none(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  uint16_t uVar1;
  void *pvVar2;
  size_t local_40;
  ssize_t bytes_avail;
  lha *lha;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  bytes_avail = (ssize_t)a->format->data;
  if (*(long *)(bytes_avail + 8) == 0) {
    *buff = (void *)0x0;
    *size = 0;
    *offset = *(int64_t *)bytes_avail;
    *(undefined1 *)(bytes_avail + 0x124) = 1;
    a_local._4_4_ = L'\0';
  }
  else {
    lha = (lha *)offset;
    offset_local = (int64_t *)size;
    size_local = (size_t *)buff;
    buff_local = (void **)a;
    pvVar2 = __archive_read_ahead(a,1,(ssize_t *)&local_40);
    *size_local = (size_t)pvVar2;
    if ((long)local_40 < 1) {
      archive_set_error((archive *)buff_local,0x54,"Truncated LHa file data");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      if (*(long *)(bytes_avail + 8) < (long)local_40) {
        local_40 = *(size_t *)(bytes_avail + 8);
      }
      uVar1 = lha_crc16(*(uint16_t *)(bytes_avail + 0x18),(void *)*size_local,local_40);
      *(uint16_t *)(bytes_avail + 0x18) = uVar1;
      *offset_local = local_40;
      lha->entry_offset = *(int64_t *)bytes_avail;
      *(size_t *)bytes_avail = local_40 + *(long *)bytes_avail;
      *(size_t *)(bytes_avail + 8) = *(long *)(bytes_avail + 8) - local_40;
      if (*(long *)(bytes_avail + 8) == 0) {
        *(undefined1 *)(bytes_avail + 0x124) = 1;
      }
      *(size_t *)(bytes_avail + 0x10) = local_40;
      a_local._4_4_ = L'\0';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
lha_read_data_none(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct lha *lha = (struct lha *)(a->format->data);
	ssize_t bytes_avail;

	if (lha->entry_bytes_remaining == 0) {
		*buff = NULL;
		*size = 0;
		*offset = lha->entry_offset;
		lha->end_of_entry = 1;
		return (ARCHIVE_OK);
	}
	/*
	 * Note: '1' here is a performance optimization.
	 * Recall that the decompression layer returns a count of
	 * available bytes; asking for more than that forces the
	 * decompressor to combine reads by copying data.
	 */
	*buff = __archive_read_ahead(a, 1, &bytes_avail);
	if (bytes_avail <= 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated LHa file data");
		return (ARCHIVE_FATAL);
	}
	if (bytes_avail > lha->entry_bytes_remaining)
		bytes_avail = (ssize_t)lha->entry_bytes_remaining;
	lha->entry_crc_calculated =
	    lha_crc16(lha->entry_crc_calculated, *buff, bytes_avail);
	*size = bytes_avail;
	*offset = lha->entry_offset;
	lha->entry_offset += bytes_avail;
	lha->entry_bytes_remaining -= bytes_avail;
	if (lha->entry_bytes_remaining == 0)
		lha->end_of_entry = 1;
	lha->entry_unconsumed = bytes_avail;
	return (ARCHIVE_OK);
}